

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

int ma_device__jack_process_callback(ma_jack_nframes_t frameCount,void *pUserData)

{
  ma_pcm_rb *pmVar1;
  bool bVar2;
  ma_result mVar3;
  ma_int32 mVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  undefined4 *puVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  void *pFramesOut;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ma_uint32 mVar16;
  void *pFramesIn;
  uint uVar17;
  long lVar18;
  ma_uint64 framesProcessedInClientFormat;
  ma_uint32 framesToProcessInClientFormat;
  ma_uint64 framesProcessedInDeviceFormat;
  void *local_1078;
  ulong local_1070;
  ulong local_1068;
  uint local_105c;
  ma_data_converter *local_1058;
  ma_pcm_rb *local_1050;
  long local_1048;
  ma_data_converter *local_1040;
  ulong local_1038 [513];
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x515a,"int ma_device__jack_process_callback(ma_jack_nframes_t, void *)");
  }
  local_1048 = *pUserData;
  if (local_1048 == 0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x515d,"int ma_device__jack_process_callback(ma_jack_nframes_t, void *)");
  }
  uVar15 = (ulong)frameCount;
  if ((*(uint *)((long)pUserData + 8) & 0xfffffffe) == 2) {
    if (*(int *)((long)pUserData + 0x2bcc) != 0) {
      lVar18 = 0;
      uVar14 = 0;
      do {
        lVar7 = (**(code **)(local_1048 + 0x180))
                          (*(undefined8 *)((long)pUserData + uVar14 * 8 + 0x5478));
        if (lVar7 != 0 && frameCount != 0) {
          uVar17 = *(uint *)((long)pUserData + 0x2bcc);
          puVar9 = (undefined4 *)(*(long *)((long)pUserData + 0x5580) + lVar18);
          lVar11 = 0;
          do {
            *puVar9 = *(undefined4 *)(lVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
            puVar9 = puVar9 + uVar17;
          } while (frameCount != (ma_jack_nframes_t)lVar11);
        }
        uVar14 = uVar14 + 1;
        lVar18 = lVar18 + 4;
      } while (uVar14 < *(uint *)((long)pUserData + 0x2bcc));
    }
    pmVar1 = *(ma_pcm_rb **)((long)pUserData + 0x5580);
    if (*(int *)((long)pUserData + 8) == 3) {
      if (frameCount == 0) {
        __assert_fail("frameCountInDeviceFormat > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x2367,
                      "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
                     );
      }
      local_1050 = pmVar1;
      if (pmVar1 == (ma_pcm_rb *)0x0) {
        __assert_fail("pFramesInDeviceFormat != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x2368,
                      "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
                     );
      }
      pmVar1 = (ma_pcm_rb *)((long)pUserData + 0x5588);
      local_1058 = (ma_data_converter *)((long)pUserData + 0x2c00);
      local_1070 = local_1070 & 0xffffffff00000000;
      do {
        local_105c = (uint)(0x1000 / (ulong)(uint)((&DAT_001157a0)
                                                   [*(uint *)((long)pUserData + 0x2ba0)] *
                                                  *(int *)((long)pUserData + 0x2ba4)));
        mVar3 = ma_pcm_rb_acquire_write(pmVar1,&local_105c,&local_1078);
        if (mVar3 == 0) {
          uVar14 = (ulong)local_105c;
          if (uVar14 == 0) {
            uVar17 = ma_pcm_rb_pointer_distance(pmVar1);
            bVar2 = false;
            if (uVar17 == *(uint *)((long)pUserData + 0x5590) /
                          (uint)((&DAT_001157a0)[*(uint *)((long)pUserData + 0x55c8)] *
                                *(int *)((long)pUserData + 0x55cc))) goto LAB_0011004a;
          }
          local_1038[0] = (ulong)(frameCount - (int)local_1070);
          local_1068 = uVar14;
          mVar3 = ma_data_converter_process_pcm_frames
                            (local_1058,local_1050,local_1038,local_1078,&local_1068);
          uVar14 = local_1038[0];
          if (mVar3 == 0) {
            mVar16 = (ma_uint32)local_1038[0];
            mVar3 = ma_pcm_rb_commit_write(pmVar1,mVar16,local_1078);
            if (mVar3 == 0) {
              local_1050 = (ma_pcm_rb *)
                           ((long)&(local_1050->rb).pBuffer +
                           (uint)((&DAT_001157a0)[*(uint *)((long)pUserData + 0x2bc8)] *
                                 *(int *)((long)pUserData + 0x2bcc)) * uVar14);
              local_1070 = CONCAT44(local_1070._4_4_,(int)local_1070 + mVar16);
              bVar2 = uVar14 != 0 || local_1068 != 0;
            }
            else {
              lVar18 = *pUserData;
              if (lVar18 == 0) goto LAB_00110042;
              if (*(code **)(lVar18 + 8) != (code *)0x0) {
                (**(code **)(lVar18 + 8))
                          (lVar18,pUserData,1,"Failed to commit capture PCM frames to ring buffer.")
                ;
              }
              bVar2 = false;
            }
          }
          else {
LAB_00110042:
            bVar2 = false;
          }
        }
        else {
          lVar18 = *pUserData;
          if ((lVar18 != 0) && (*(code **)(lVar18 + 8) != (code *)0x0)) {
            (**(code **)(lVar18 + 8))
                      (lVar18,pUserData,1,"Failed to acquire capture PCM frames from ring buffer.");
          }
          bVar2 = false;
        }
LAB_0011004a:
      } while (bVar2);
    }
    else {
      ma_device__send_frames_to_client((ma_device *)pUserData,frameCount,pmVar1);
    }
  }
  if (*(int *)((long)pUserData + 8) == 1) {
    ma_device__read_frames_from_client
              ((ma_device *)pUserData,frameCount,*(void **)((long)pUserData + 0x5578));
  }
  else {
    if (*(int *)((long)pUserData + 8) != 3) {
      return 0;
    }
    if (frameCount == 0) {
      __assert_fail("frameCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x23a3,
                    "ma_result ma_device__handle_duplex_callback_playback(ma_device *, ma_uint32, void *, ma_pcm_rb *)"
                   );
    }
    pFramesOut = *(void **)((long)pUserData + 0x5578);
    if (pFramesOut == (void *)0x0) {
      __assert_fail("pFramesInInternalFormat != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x23a4,
                    "ma_result ma_device__handle_duplex_callback_playback(ma_device *, ma_uint32, void *, ma_pcm_rb *)"
                   );
    }
    local_1070 = uVar15;
    if ((*(byte *)((long)pUserData + 0x2a90) & 8) != 0) {
      local_1070 = ma_resampler_get_required_input_frame_count
                             ((ma_resampler *)((long)pUserData + 0x2420),uVar15);
    }
    local_1050 = (ma_pcm_rb *)((long)pUserData + 0x5588);
    local_1040 = (ma_data_converter *)((long)pUserData + 0x328);
    uVar17 = 0;
    local_1058 = (ma_data_converter *)0x0;
    do {
      uVar10 = (uint)local_1070 - uVar17;
      if (((uint)local_1070 < uVar17 || uVar10 == 0) || (*(int *)((long)pUserData + 0x10) != 2))
      break;
      uVar12 = (uint)(0x1000 / (ulong)(uint)((&DAT_001157a0)[*(uint *)((long)pUserData + 0x2c8)] *
                                            *(int *)((long)pUserData + 0x2cc)));
      if (uVar12 < uVar10) {
        uVar10 = uVar12;
      }
      uVar12 = (&DAT_001157a0)[*(uint *)((long)pUserData + 0x55c8)] *
               *(int *)((long)pUserData + 0x55cc);
      if ((int)(*(uint *)((long)pUserData + 0x559c) ^ *(uint *)((long)pUserData + 0x55a0)) < 0) {
        uVar8 = *(uint *)((long)pUserData + 0x5590);
      }
      else {
        uVar8 = *(uint *)((long)pUserData + 0x55a0) & 0x7fffffff;
      }
      uVar8 = uVar8 - (*(uint *)((long)pUserData + 0x559c) & 0x7fffffff);
      if (uVar10 * uVar12 < uVar8) {
        uVar8 = uVar10 * uVar12;
      }
      pFramesIn = (void *)((ulong)(*(uint *)((long)pUserData + 0x559c) & 0x7fffffff) +
                          *(long *)((long)pUserData + 0x5588));
      mVar16 = (ma_uint32)((ulong)uVar8 / (ulong)uVar12);
      if (uVar8 < uVar12) {
        mVar4 = ma_pcm_rb_pointer_distance(local_1050);
        if (mVar4 != 0) goto LAB_00110206;
LAB_0011021d:
        bVar2 = false;
      }
      else {
        ma_device__on_data((ma_device *)pUserData,local_1038,pFramesIn,mVar16);
LAB_00110206:
        if ((void *)((ulong)(*(uint *)((long)pUserData + 0x559c) & 0x7fffffff) +
                    *(long *)((long)pUserData + 0x5588)) != pFramesIn) goto LAB_0011021d;
        uVar10 = (*(uint *)((long)pUserData + 0x559c) & 0x7fffffff) +
                 *(int *)((long)pUserData + 0x55cc) * mVar16 *
                 (&DAT_001157a0)[*(uint *)((long)pUserData + 0x55c8)];
        if (*(uint *)((long)pUserData + 0x5590) < uVar10) {
          bVar2 = false;
        }
        else {
          uVar5 = *(uint *)((long)pUserData + 0x559c) & 0x80000000;
          uVar6 = uVar5 ^ 0x80000000;
          if (uVar10 != *(uint *)((long)pUserData + 0x5590)) {
            uVar6 = uVar10 | uVar5;
          }
          LOCK();
          *(uint *)((long)pUserData + 0x559c) = uVar6;
          UNLOCK();
          iVar13 = (int)local_1058;
          local_1078 = (void *)(ulong)(frameCount - iVar13);
          local_1068 = (ulong)uVar8 / (ulong)uVar12;
          ma_data_converter_process_pcm_frames
                    (local_1040,local_1038,&local_1068,pFramesOut,(ma_uint64 *)&local_1078);
          uVar17 = uVar17 + (int)local_1068;
          local_1058 = (ma_data_converter *)(ulong)(uint)(iVar13 + (int)local_1078);
          pFramesOut = (void *)((long)pFramesOut +
                               (ulong)(uint)((&DAT_001157a0)[*(uint *)((long)pUserData + 0x2f0)] *
                                            *(int *)((long)pUserData + 0x2f4)) * (long)local_1078);
          bVar2 = true;
        }
      }
    } while (bVar2);
  }
  if (*(int *)((long)pUserData + 0x2f4) != 0) {
    lVar18 = 0;
    uVar15 = 0;
    do {
      lVar7 = (**(code **)(local_1048 + 0x180))
                        (*(undefined8 *)((long)pUserData + uVar15 * 8 + 0x5378));
      if (lVar7 != 0 && frameCount != 0) {
        uVar17 = *(uint *)((long)pUserData + 0x2f4);
        puVar9 = (undefined4 *)(*(long *)((long)pUserData + 0x5578) + lVar18);
        lVar11 = 0;
        do {
          *(undefined4 *)(lVar7 + lVar11 * 4) = *puVar9;
          lVar11 = lVar11 + 1;
          puVar9 = puVar9 + uVar17;
        } while (frameCount != (ma_jack_nframes_t)lVar11);
      }
      uVar15 = uVar15 + 1;
      lVar18 = lVar18 + 4;
    } while (uVar15 < *(uint *)((long)pUserData + 0x2f4));
  }
  return 0;
}

Assistant:

static int ma_device__jack_process_callback(ma_jack_nframes_t frameCount, void* pUserData)
{
    ma_device* pDevice;
    ma_context* pContext;
    ma_uint32 iChannel;

    pDevice = (ma_device*)pUserData;
    MA_ASSERT(pDevice != NULL);

    pContext = pDevice->pContext;
    MA_ASSERT(pContext != NULL);

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        /* Channels need to be interleaved. */
        for (iChannel = 0; iChannel < pDevice->capture.internalChannels; ++iChannel) {
            const float* pSrc = (const float*)((ma_jack_port_get_buffer_proc)pContext->jack.jack_port_get_buffer)((ma_jack_port_t*)pDevice->jack.pPortsCapture[iChannel], frameCount);
            if (pSrc != NULL) {
                float* pDst = pDevice->jack.pIntermediaryBufferCapture + iChannel;
                ma_jack_nframes_t iFrame;
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    *pDst = *pSrc;

                    pDst += pDevice->capture.internalChannels;
                    pSrc += 1;
                }
            }
        }

        if (pDevice->type == ma_device_type_duplex) {
            ma_device__handle_duplex_callback_capture(pDevice, frameCount, pDevice->jack.pIntermediaryBufferCapture, &pDevice->jack.duplexRB);
        } else {
            ma_device__send_frames_to_client(pDevice, frameCount, pDevice->jack.pIntermediaryBufferCapture);
        }
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        if (pDevice->type == ma_device_type_duplex) {
            ma_device__handle_duplex_callback_playback(pDevice, frameCount, pDevice->jack.pIntermediaryBufferPlayback, &pDevice->jack.duplexRB);
        } else {
            ma_device__read_frames_from_client(pDevice, frameCount, pDevice->jack.pIntermediaryBufferPlayback);
        }

        /* Channels need to be deinterleaved. */
        for (iChannel = 0; iChannel < pDevice->playback.internalChannels; ++iChannel) {
            float* pDst = (float*)((ma_jack_port_get_buffer_proc)pContext->jack.jack_port_get_buffer)((ma_jack_port_t*)pDevice->jack.pPortsPlayback[iChannel], frameCount);
            if (pDst != NULL) {
                const float* pSrc = pDevice->jack.pIntermediaryBufferPlayback + iChannel;
                ma_jack_nframes_t iFrame;
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    *pDst = *pSrc;

                    pDst += 1;
                    pSrc += pDevice->playback.internalChannels;
                }
            }
        }
    }

    return 0;
}